

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.hpp
# Opt level: O0

IBufferView * __thiscall
Diligent::BufferBase<Diligent::EngineVkImplTraits>::GetDefaultView
          (BufferBase<Diligent::EngineVkImplTraits> *this,BUFFER_VIEW_TYPE ViewType)

{
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  BUFFER_VIEW_TYPE ViewType_local;
  BufferBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._M_local_buf[0xf] = ViewType;
  if (ViewType == BUFFER_VIEW_SHADER_RESOURCE) {
    this_local = (BufferBase<Diligent::EngineVkImplTraits> *)
                 std::
                 unique_ptr<Diligent::BufferViewVkImpl,_Diligent::STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator>_>
                 ::get(&this->m_pDefaultSRV);
  }
  else if (ViewType == BUFFER_VIEW_UNORDERED_ACCESS) {
    this_local = (BufferBase<Diligent::EngineVkImplTraits> *)
                 std::
                 unique_ptr<Diligent::BufferViewVkImpl,_Diligent::STDDeleter<Diligent::BufferViewVkImpl,_Diligent::FixedBlockMemoryAllocator>_>
                 ::get(&this->m_pDefaultUAV);
  }
  else {
    FormatString<char[18]>((string *)local_40,(char (*) [18])"Unknown view type");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetDefaultView",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0x90);
    std::__cxx11::string::~string((string *)local_40);
    this_local = (BufferBase<Diligent::EngineVkImplTraits> *)0x0;
  }
  return (IBufferView *)this_local;
}

Assistant:

GetDefaultView(BUFFER_VIEW_TYPE ViewType) override
    {
        switch (ViewType)
        {
            case BUFFER_VIEW_SHADER_RESOURCE: return m_pDefaultSRV.get();
            case BUFFER_VIEW_UNORDERED_ACCESS: return m_pDefaultUAV.get();
            default: UNEXPECTED("Unknown view type"); return nullptr;
        }
    }